

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_unlink_check(lyd_node *node)

{
  lysc_node *local_30;
  ly_ctx *local_20;
  lyd_node *node_local;
  
  if (node == (lyd_node *)0x0) {
    node_local._4_4_ = LY_SUCCESS;
  }
  else if ((((node->schema == (lysc_node *)0x0) || (node->schema->nodetype != 4)) ||
           ((node->schema->flags & 0x100) == 0)) || (node->parent == (lyd_node_inner *)0x0)) {
    node_local._4_4_ = LY_SUCCESS;
  }
  else {
    if (node->schema == (lysc_node *)0x0) {
      local_20 = (ly_ctx *)node[2].schema;
    }
    else {
      local_20 = node->schema->module->ctx;
    }
    if (node->schema == (lysc_node *)0x0) {
      local_30 = node[1].schema;
    }
    else {
      local_30 = (lysc_node *)node->schema->name;
    }
    ly_log(local_20,LY_LLERR,LY_EINVAL,
           "Cannot unlink a list key \"%s\", unlink the list instance instead.",local_30);
    node_local._4_4_ = LY_EINVAL;
  }
  return node_local._4_4_;
}

Assistant:

static LY_ERR
lyd_unlink_check(struct lyd_node *node)
{
    if (!node) {
        return LY_SUCCESS;
    }

    if (lysc_is_key(node->schema) && node->parent) {
        LOGERR(LYD_CTX(node), LY_EINVAL, "Cannot unlink a list key \"%s\", unlink the list instance instead.",
                LYD_NAME(node));
        return LY_EINVAL;
    }

    return LY_SUCCESS;
}